

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O2

void __thiscall SmallArray<DelayedType,_32U>::grow(SmallArray<DelayedType,_32U> *this,uint newSize)

{
  undefined4 *puVar1;
  undefined4 *puVar2;
  uint count;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  DelayedType *pDVar6;
  long lVar7;
  uint i;
  uint uVar8;
  DelayedType *pDVar9;
  ulong uVar10;
  
  uVar8 = (this->max >> 1) + this->max;
  count = newSize + 4;
  if (newSize < uVar8) {
    count = uVar8;
  }
  if (this->allocator == (Allocator *)0x0) {
    pDVar6 = (DelayedType *)(*(code *)NULLC::alloc)(count << 4 | 4);
    if (count != 0) {
      pDVar9 = pDVar6;
      do {
        pDVar9->index = 0;
        pDVar9->constants = (ExternConstantInfo *)0x0;
        pDVar9 = pDVar9 + 1;
      } while (pDVar9 != pDVar6 + (int)count);
    }
  }
  else {
    pDVar6 = Allocator::construct<DelayedType>(this->allocator,count);
  }
  lVar7 = 0;
  uVar10 = 0;
  while( true ) {
    pDVar9 = this->data;
    if (this->count <= uVar10) break;
    puVar1 = (undefined4 *)((long)&pDVar9->index + lVar7);
    uVar3 = puVar1[1];
    uVar4 = puVar1[2];
    uVar5 = puVar1[3];
    puVar2 = (undefined4 *)((long)&pDVar6->index + lVar7);
    *puVar2 = *puVar1;
    puVar2[1] = uVar3;
    puVar2[2] = uVar4;
    puVar2[3] = uVar5;
    uVar10 = uVar10 + 1;
    lVar7 = lVar7 + 0x10;
  }
  if (pDVar9 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pDVar9 != (DelayedType *)0x0) {
        (*(code *)NULLC::dealloc)(pDVar9);
      }
    }
    else if (pDVar9 != (DelayedType *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  this->data = pDVar6;
  this->max = count;
  return;
}

Assistant:

void grow(unsigned newSize)
	{
		if(max + (max >> 1) > newSize)
			newSize = max + (max >> 1);
		else
			newSize += 4;

		T* newData = 0;
		
		if(allocator)
			newData = allocator->construct<T>(newSize);
		else
			newData = NULLC::construct<T>(newSize);

		for(unsigned i = 0; i < count; i++)
			newData[i] = data[i];

		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}

		data = newData;

		max = newSize;
	}